

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Status __thiscall leveldb::DBImpl::MakeRoomForWrite(DBImpl *this,bool force)

{
  _func_int **pp_Var1;
  char *state;
  VersionSet *pVVar2;
  uint64_t number;
  Env *pEVar3;
  DB DVar4;
  WritableFile *dest;
  int iVar5;
  _func_int **pp_Var6;
  size_t sVar7;
  Writer *pWVar8;
  MemTable *this_00;
  uint in_EDX;
  undefined7 in_register_00000031;
  DBImpl *this_01;
  uint uVar9;
  long in_FS_OFFSET;
  WritableFile *lfile;
  DB local_68;
  WritableFile *local_60;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  this_01 = (DBImpl *)CONCAT71(in_register_00000031,force);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this_01->writers_).
      super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (this_01->writers_).
      super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur) {
    __assert_fail("!writers_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x52b,"Status leveldb::DBImpl::MakeRoomForWrite(bool)");
  }
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  pp_Var6 = (_func_int **)(this_01->bg_error_).state_;
  if (pp_Var6 == (_func_int **)0x0) {
    uVar9 = in_EDX ^ 1;
    do {
      if (((uVar9 & 1) == 0) || (iVar5 = VersionSet::NumLevelFiles(this_01->versions_,0), iVar5 < 8)
         ) {
        if (((in_EDX & 1) == 0) &&
           (sVar7 = MemTable::ApproximateMemoryUsage(this_01->mem_),
           sVar7 <= (this_01->options_).write_buffer_size)) goto LAB_0066f3a8;
        if (this_01->imm_ == (MemTable *)0x0) {
          iVar5 = VersionSet::NumLevelFiles(this_01->versions_,0);
          if (iVar5 < 0xc) {
            pVVar2 = this_01->versions_;
            if (pVVar2->prev_log_number_ != 0) goto LAB_0066f3e9;
            number = pVVar2->next_file_number_;
            pVVar2->next_file_number_ = number + 1;
            local_60 = (WritableFile *)0x0;
            pEVar3 = this_01->env_;
            LogFileName((string *)local_58,&this_01->dbname_,number);
            (*pEVar3->_vptr_Env[4])(&local_68,pEVar3,(string *)local_58,&local_60);
            DVar4._vptr_DB = local_68._vptr_DB;
            pp_Var6 = (this->super_DB)._vptr_DB;
            (this->super_DB)._vptr_DB = local_68._vptr_DB;
            local_68._vptr_DB = pp_Var6;
            if (pp_Var6 != (_func_int **)0x0) {
              operator_delete__(pp_Var6);
            }
            if ((mutex_type *)local_58._0_8_ != (mutex_type *)(local_58 + 0x10)) {
              operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
            }
            if (DVar4._vptr_DB == (_func_int **)0x0) {
              pWVar8 = this_01->log_;
              if (pWVar8 != (Writer *)0x0) {
                log::Writer::~Writer(pWVar8);
                operator_delete(pWVar8,0x20);
              }
              if (this_01->logfile_ != (WritableFile *)0x0) {
                (*this_01->logfile_->_vptr_WritableFile[1])();
              }
              dest = local_60;
              this_01->logfile_ = local_60;
              this_01->logfile_number_ = number;
              pWVar8 = (Writer *)operator_new(0x20);
              log::Writer::Writer(pWVar8,dest);
              this_01->log_ = pWVar8;
              this_01->imm_ = this_01->mem_;
              (this_01->has_imm_)._M_base._M_i = true;
              this_00 = (MemTable *)operator_new(0x70);
              MemTable::MemTable(this_00,&this_01->internal_comparator_);
              this_01->mem_ = this_00;
              this_00->refs_ = this_00->refs_ + 1;
              MaybeScheduleCompaction(this_01);
              in_EDX = 0;
            }
            else if (this_01->versions_->next_file_number_ == number + 1) {
              this_01->versions_->next_file_number_ = number;
            }
            if (DVar4._vptr_DB == (_func_int **)0x0) goto LAB_0066f213;
            goto LAB_0066f3a8;
          }
          Log((this_01->options_).info_log,"Too many L0 files; waiting...\n");
        }
        else {
          Log((this_01->options_).info_log,"Current memtable full; waiting...\n");
        }
        local_58._0_8_ = (this_01->background_work_finished_signal_).mu_;
        local_58[8] = true;
        std::condition_variable::wait((unique_lock *)&this_01->background_work_finished_signal_);
        local_58._0_8_ = (mutex_type *)0x0;
        local_58[8] = false;
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_58);
      }
      else {
        pthread_mutex_unlock((pthread_mutex_t *)&this_01->mutex_);
        (*this_01->env_->_vptr_Env[0x14])();
        iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this_01->mutex_);
        if (iVar5 != 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            std::__throw_system_error(iVar5);
LAB_0066f3e9:
            __assert_fail("versions_->PrevLogNumber() == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_impl.cc"
                          ,0x54e,"Status leveldb::DBImpl::MakeRoomForWrite(bool)");
          }
          goto LAB_0066f4ae;
        }
        uVar9 = 0;
      }
LAB_0066f213:
      pp_Var6 = (_func_int **)(this_01->bg_error_).state_;
    } while (pp_Var6 == (_func_int **)0x0);
  }
  pp_Var1 = (this->super_DB)._vptr_DB;
  if (pp_Var1 != pp_Var6) {
    if (pp_Var1 != (_func_int **)0x0) {
      operator_delete__(pp_Var1);
    }
    state = (this_01->bg_error_).state_;
    if (state == (char *)0x0) {
      pp_Var6 = (_func_int **)0x0;
    }
    else {
      pp_Var6 = (_func_int **)Status::CopyState(state);
    }
    (this->super_DB)._vptr_DB = pp_Var6;
  }
LAB_0066f3a8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Status)(char *)this;
  }
LAB_0066f4ae:
  __stack_chk_fail();
}

Assistant:

Status DBImpl::MakeRoomForWrite(bool force) {
  mutex_.AssertHeld();
  assert(!writers_.empty());
  bool allow_delay = !force;
  Status s;
  while (true) {
    if (!bg_error_.ok()) {
      // Yield previous error
      s = bg_error_;
      break;
    } else if (allow_delay && versions_->NumLevelFiles(0) >=
                                  config::kL0_SlowdownWritesTrigger) {
      // We are getting close to hitting a hard limit on the number of
      // L0 files.  Rather than delaying a single write by several
      // seconds when we hit the hard limit, start delaying each
      // individual write by 1ms to reduce latency variance.  Also,
      // this delay hands over some CPU to the compaction thread in
      // case it is sharing the same core as the writer.
      mutex_.Unlock();
      env_->SleepForMicroseconds(1000);
      allow_delay = false;  // Do not delay a single write more than once
      mutex_.Lock();
    } else if (!force &&
               (mem_->ApproximateMemoryUsage() <= options_.write_buffer_size)) {
      // There is room in current memtable
      break;
    } else if (imm_ != nullptr) {
      // We have filled up the current memtable, but the previous
      // one is still being compacted, so we wait.
      Log(options_.info_log, "Current memtable full; waiting...\n");
      background_work_finished_signal_.Wait();
    } else if (versions_->NumLevelFiles(0) >= config::kL0_StopWritesTrigger) {
      // There are too many level-0 files.
      Log(options_.info_log, "Too many L0 files; waiting...\n");
      background_work_finished_signal_.Wait();
    } else {
      // Attempt to switch to a new memtable and trigger compaction of old
      assert(versions_->PrevLogNumber() == 0);
      uint64_t new_log_number = versions_->NewFileNumber();
      WritableFile* lfile = nullptr;
      s = env_->NewWritableFile(LogFileName(dbname_, new_log_number), &lfile);
      if (!s.ok()) {
        // Avoid chewing through file number space in a tight loop.
        versions_->ReuseFileNumber(new_log_number);
        break;
      }
      delete log_;
      delete logfile_;
      logfile_ = lfile;
      logfile_number_ = new_log_number;
      log_ = new log::Writer(lfile);
      imm_ = mem_;
      has_imm_.store(true, std::memory_order_release);
      mem_ = new MemTable(internal_comparator_);
      mem_->Ref();
      force = false;  // Do not force another compaction if have room
      MaybeScheduleCompaction();
    }
  }
  return s;
}